

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_SimpleStringBuffer_setWriteLimit_TestShell::createTest
          (TEST_SimpleStringBuffer_setWriteLimit_TestShell *this)

{
  Utest *this_00;
  TEST_SimpleStringBuffer_setWriteLimit_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0x24f);
  TEST_SimpleStringBuffer_setWriteLimit_Test::TEST_SimpleStringBuffer_setWriteLimit_Test
            ((TEST_SimpleStringBuffer_setWriteLimit_Test *)this_00);
  return this_00;
}

Assistant:

TEST(SimpleStringBuffer, setWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    SimpleString str("h", 10);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}